

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  if (file == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,file,&local_39);
    bVar1 = SetPermissions(&local_38,mode,honor_umask);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

bool SystemTools::SetPermissions(const char* file, mode_t mode,
                                 bool honor_umask)
{
  if (!file) {
    return false;
  }
  return SystemTools::SetPermissions(std::string(file), mode, honor_umask);
}